

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O0

bool __thiscall Js::LazyJSONString::HasComplexGap(LazyJSONString *this)

{
  char16_t **ppcVar1;
  uint local_1c;
  charcount_t i;
  LazyJSONString *this_local;
  
  local_1c = 0;
  while( true ) {
    if (*(uint *)&(this->super_JavascriptString).field_0x1c <= local_1c) {
      return false;
    }
    ppcVar1 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)&this->gap);
    if ((1 < (ushort)(*ppcVar1)[local_1c] - 9) && ((ushort)(*ppcVar1)[local_1c] != 0x20)) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool
LazyJSONString::HasComplexGap() const
{
    for (charcount_t i = 0; i < this->gapLength; ++i)
    {
        switch (this->gap[i])
        {
        // This is not exhaustive, just a useful subset of semantics preserving characters
        case _u(' '):
        case _u('\t'):
        case _u('\n'):
            continue;
        default:
            return true;
        }
    }
    return false;
}